

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

__m256i * scan_32(__m256i x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i s02;
  __m128i s01;
  int32_t s;
  __m256i x04;
  __m256i x03;
  __m256i x02;
  __m256i x01;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 uStack_1d4;
  
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar4 = vpslldq_avx2(auVar4,4);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar4 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpslldq_avx2(auVar4,8);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  uStack_1d4 = auVar4._12_4_;
  auVar1 = vpinsrd_avx(ZEXT416(uStack_1d4),uStack_1d4,1);
  auVar1 = vpinsrd_avx(auVar1,uStack_1d4,2);
  auVar1 = vpinsrd_avx(auVar1,uStack_1d4,3);
  auVar2 = ZEXT116(1) * auVar1;
  uStack_210 = auVar2._0_8_;
  uStack_208 = auVar2._8_8_;
  auVar5._16_8_ = uStack_210;
  auVar5._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * (SUB3216(ZEXT832(0),0) << 0x20);
  auVar5._24_8_ = uStack_208;
  vpaddd_avx2(auVar4,auVar5);
  return (__m256i *)(ulong)uStack_1d4;
}

Assistant:

static __m256i scan_32(__m256i x) {
  const __m256i x01 = _mm256_slli_si256(x, 4);
  const __m256i x02 = _mm256_add_epi32(x, x01);
  const __m256i x03 = _mm256_slli_si256(x02, 8);
  const __m256i x04 = _mm256_add_epi32(x02, x03);
  const int32_t s = _mm256_extract_epi32(x04, 3);
  const __m128i s01 = _mm_set1_epi32(s);
  const __m256i s02 = _mm256_insertf128_si256(_mm256_setzero_si256(), s01, 1);
  return _mm256_add_epi32(x04, s02);
}